

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FixTriggerStep(DbFixer *pFix,TriggerStep *pStep)

{
  undefined8 *puVar1;
  int iVar2;
  Upsert *pUp;
  TriggerStep *pStep_local;
  DbFixer *pFix_local;
  
  pUp = (Upsert *)pStep;
  while( true ) {
    if (pUp == (Upsert *)0x0) {
      return 0;
    }
    iVar2 = sqlite3FixSelect(pFix,(Select *)pUp->pUpsertSet);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3FixExpr(pFix,(Expr *)pUp->pUpsertIdx);
    if (iVar2 != 0) {
      return 1;
    }
    iVar2 = sqlite3FixExprList(pFix,(ExprList *)pUp->pUpsertSrc);
    if (iVar2 != 0) break;
    if (*(long *)&pUp->iIdxCur != 0) {
      puVar1 = *(undefined8 **)&pUp->iIdxCur;
      iVar2 = sqlite3FixExprList(pFix,(ExprList *)*puVar1);
      if ((((iVar2 != 0) || (iVar2 = sqlite3FixExpr(pFix,(Expr *)puVar1[1]), iVar2 != 0)) ||
          (iVar2 = sqlite3FixExprList(pFix,(ExprList *)puVar1[2]), iVar2 != 0)) ||
         (iVar2 = sqlite3FixExpr(pFix,(Expr *)puVar1[3]), iVar2 != 0)) {
        return 1;
      }
    }
    pUp = (Upsert *)pUp[1].pUpsertTargetWhere;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixTriggerStep(
  DbFixer *pFix,     /* Context of the fixation */
  TriggerStep *pStep /* The trigger step be fixed to one database */
){
  while( pStep ){
    if( sqlite3FixSelect(pFix, pStep->pSelect) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pStep->pWhere) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pStep->pExprList) ){
      return 1;
    }
#ifndef SQLITE_OMIT_UPSERT
    if( pStep->pUpsert ){
      Upsert *pUp = pStep->pUpsert;
      if( sqlite3FixExprList(pFix, pUp->pUpsertTarget)
       || sqlite3FixExpr(pFix, pUp->pUpsertTargetWhere)
       || sqlite3FixExprList(pFix, pUp->pUpsertSet)
       || sqlite3FixExpr(pFix, pUp->pUpsertWhere)
      ){
        return 1;
      }
    }
#endif
    pStep = pStep->pNext;
  }
  return 0;
}